

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

void __thiscall
flatbuffers::rust::RustGenerator::ForAllEnumValues
          (RustGenerator *this,EnumDef *enum_def,function<void_()> *cb)

{
  function<void_(const_flatbuffers::EnumVal_&)> wrapped;
  _Any_data _Stack_58;
  _Manager_type local_48;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:699:52)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:699:52)>
             ::_M_manager;
  local_38._M_unused._M_object = cb;
  std::function<void_(const_flatbuffers::EnumVal_&)>::function
            ((function<void_(const_flatbuffers::EnumVal_&)> *)&_Stack_58,
             (function<void_(const_flatbuffers::EnumVal_&)> *)&local_38);
  ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&_Stack_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void ForAllEnumValues(const EnumDef &enum_def, std::function<void()> cb) {
    std::function<void(const EnumVal &)> wrapped = [&](const EnumVal &unused) {
      (void)unused;
      cb();
    };
    ForAllEnumValues1(enum_def, wrapped);
  }